

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * __thiscall
trieste::detail::Pattern::operator~(Pattern *__return_storage_ptr__,Pattern *this)

{
  FastPattern local_a0;
  shared_ptr<trieste::detail::Opt> local_38;
  shared_ptr<trieste::detail::PatternDef> local_28;
  Pattern *local_18;
  Pattern *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  std::make_shared<trieste::detail::Opt,std::shared_ptr<trieste::detail::PatternDef>const&>
            ((shared_ptr<trieste::detail::PatternDef> *)&local_38);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::Opt,void>
            (&local_28,&local_38);
  FastPattern::match_opt(&local_a0,&this->fast_pattern);
  Pattern(__return_storage_ptr__,(PatternPtr *)&local_28,&local_a0);
  FastPattern::~FastPattern(&local_a0);
  CLI::std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)&local_28);
  std::shared_ptr<trieste::detail::Opt>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator~() const
      {
        return {
          std::make_shared<Opt>(pattern), FastPattern::match_opt(fast_pattern)};
      }